

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs
          (FeHierarchicQuad<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  RefEl *pRVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *pDVar6;
  undefined8 uVar7;
  LhsNested LVar8;
  size_type sVar9;
  uint uVar10;
  CoeffReturnType pdVar11;
  Scalar *pSVar12;
  undefined8 *puVar13;
  QuadRule *pQVar14;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  ulong uVar15;
  double *pdVar16;
  RhsNested RVar17;
  ulong extraout_RDX;
  uint uVar18;
  uint uVar19;
  double *pdVar20;
  long lVar21;
  NestedExpressionType pMVar22;
  int iVar23;
  uint uVar24;
  Index col;
  long lVar25;
  ulong i;
  ulong uVar26;
  double dVar27;
  Matrix<double,_1,__1,_1,_1,__1> MVar28;
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  Matrix<double,__1,__1,_0,__1,__1> dof_temp2;
  scalar_product_op<double,_double> local_209;
  FeHierarchicQuad<double> *local_208;
  Matrix<double,_1,__1,_1,_1,__1> *local_200;
  undefined1 local_1f8 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1e8;
  double local_1d0;
  double local_1c8;
  Scalar local_1c0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1b8;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  variable_if_dynamic<long,__1> local_178;
  XprTypeNested pMStack_170;
  variable_if_dynamic<long,__1> local_168;
  variable_if_dynamic<long,__1> vStack_160;
  Index local_158;
  ulong local_148;
  double local_140;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_138;
  uint local_fc;
  double *local_f8;
  LhsNested local_f0;
  RhsNested local_e8;
  variable_if_dynamic<long,__1> local_c8;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  FeHierarchicSegment<double> local_68 [2];
  
  sVar9 = NumRefShapeFunctions((FeHierarchicQuad<double> *)nodevals);
  this->super_ScalarReferenceFiniteElement<double> = (_func_int **)0x0;
  this->interior_degree_ = 0;
  (this->edge_degrees_)._M_elems[0] = 0;
  local_208 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,(ulong)sVar9);
  uVar18 = 0;
  uVar10 = 0;
  if (1 < *(uint *)((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                           ).m_storage.m_cols + 4)) {
    uVar10 = *(uint *)(nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_data + 3);
  }
  if (1 < *(uint *)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                    m_storage.m_data) {
    uVar18 = *(uint *)(nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_cols + 0x18);
  }
  uVar24 = 0;
  uVar19 = 0;
  if (1 < *(uint *)((long)&nodevals[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                           m_data + 4)) {
    uVar19 = *(uint *)(nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_data + 3);
  }
  if (1 < (uint)nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_cols) {
    uVar24 = *(uint *)(nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_cols + 0x18);
  }
  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,0);
  local_200 = (Matrix<double,_1,__1,_1,_1,__1> *)*pdVar11;
  pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208,0);
  *pSVar12 = (Scalar)local_200;
  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,1);
  local_200 = (Matrix<double,_1,__1,_1,_1,__1> *)*pdVar11;
  pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208,1);
  *pSVar12 = (Scalar)local_200;
  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,2);
  local_200 = (Matrix<double,_1,__1,_1,_1,__1> *)*pdVar11;
  pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208,2);
  *pSVar12 = (Scalar)local_200;
  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,3);
  local_200 = (Matrix<double,_1,__1,_1,_1,__1> *)*pdVar11;
  pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208,3);
  *pSVar12 = (Scalar)local_200;
  local_70 = (ulong)uVar10;
  local_78 = (ulong)(uVar10 + 4);
  local_80 = (ulong)uVar18;
  uVar18 = uVar10 + 4 + uVar18;
  local_88 = (ulong)uVar18;
  local_90 = (ulong)uVar19;
  local_148 = (ulong)(uVar18 + uVar19);
  local_98 = (ulong)uVar24;
  uVar18 = 2;
  local_1a0 = in_RDX;
  local_fc = uVar24;
  while( true ) {
    local_1f8._0_4_ = uVar18;
    uVar10 = Degree((FeHierarchicQuad<double> *)nodevals);
    if (uVar10 + 1 <= uVar18) break;
    local_200 = (Matrix<double,_1,__1,_1,_1,__1> *)ILegendreDx(local_1f8._0_4_,0.0,1.0);
    local_140 = ILegendreDx(local_1f8._0_4_,1.0,1.0);
    if ((uint)local_1f8._0_4_ <=
        *(uint *)((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                         m_storage.m_cols + 4)) {
      local_f8 = nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                 m_storage.m_data + 1;
      local_1e8.m_storage.m_data = (double *)0x0;
      local_1e8.m_storage.m_rows = 0;
      local_f0.m_expression.m_matrix = (NestedExpressionType)(non_const_type)local_1f8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1e8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1572:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_f8);
      LVar8.m_expression.m_matrix = local_f0.m_expression.m_matrix;
      pdVar20 = (double *)*local_f8;
      dVar3 = local_f8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1e8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1572:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_f8,(assign_op<double,_double> *)local_188);
      if (0 < local_1e8.m_storage.m_rows) {
        pdVar4 = local_1e8.m_storage.m_data;
        lVar25 = 0;
        do {
          dVar27 = LegendreDx(*(int *)LVar8.m_expression.m_matrix - 1,*pdVar20,1.0);
          pdVar4[lVar25] = dVar27;
          lVar25 = lVar25 + 1;
          pdVar20 = pdVar20 + (long)dVar3;
        } while (lVar25 < local_1e8.m_storage.m_rows);
      }
      local_1b8.m_storage.m_data =
           nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_data + 4;
      local_198._0_8_ = &local_1e8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                       *)local_68,(Lhs *)&local_1b8,(Rhs *)local_198,
                      (scalar_product_op<double,_double> *)local_188);
      pDVar6 = local_1a0;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_138,
                 (Matrix<double,_1,__1,_1,_1,__1> *)local_1a0,0,4,1,local_70);
      local_158 = local_138.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_outerStride;
      local_168.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startRow.m_value;
      vStack_160.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_178.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_cols.m_value;
      pMStack_170 = local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr;
      local_188._0_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      local_188._8_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           _8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_f8,(Lhs *)local_68,(Rhs *)local_188,&local_209);
      if (local_c8.m_value == 0) {
        local_1c0 = 0.0;
      }
      else {
        local_1c0 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_f8,(scalar_sum_op<double,_double> *)&local_209);
      }
      if (*(int *)nodevals[5].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols == 1) {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,1);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,0);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)(local_1f8._0_4_ + 2));
      }
      else {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,0);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,1);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)((*(int *)((long)&(nodevals->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1f8._0_4_) + 4));
      }
      *pSVar12 = (double)(iVar23 * 2 - 1) *
                 ((local_1c8 * local_140 - local_1d0 * (double)local_200) - local_1c0);
      free(local_1e8.m_storage.m_data);
    }
    uVar18 = local_1f8._0_4_;
    if ((uint)local_1f8._0_4_ <=
        *(uint *)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_data) {
      local_f8 = (double *)
                 (nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols + 8);
      local_1e8.m_storage.m_data = (double *)0x0;
      local_1e8.m_storage.m_rows = 0;
      local_f0.m_expression.m_matrix = (NestedExpressionType)(non_const_type)local_1f8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1e8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1588:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_f8);
      LVar8.m_expression.m_matrix = local_f0.m_expression.m_matrix;
      pdVar20 = (double *)*local_f8;
      dVar3 = local_f8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1e8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1588:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_f8,(assign_op<double,_double> *)local_188);
      if (0 < local_1e8.m_storage.m_rows) {
        pdVar4 = local_1e8.m_storage.m_data;
        lVar25 = 0;
        do {
          dVar27 = LegendreDx(*(int *)LVar8.m_expression.m_matrix - 1,*pdVar20,1.0);
          pdVar4[lVar25] = dVar27;
          lVar25 = lVar25 + 1;
          pdVar20 = pdVar20 + (long)dVar3;
        } while (lVar25 < local_1e8.m_storage.m_rows);
      }
      local_1b8.m_storage.m_data =
           (double *)
           (nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols + 0x20);
      local_198._0_8_ = &local_1e8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                       *)local_68,(Lhs *)&local_1b8,(Rhs *)local_198,
                      (scalar_product_op<double,_double> *)local_188);
      pDVar6 = local_1a0;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_138,
                 (Matrix<double,_1,__1,_1,_1,__1> *)local_1a0,0,local_78,1,local_80);
      local_158 = local_138.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_outerStride;
      local_168.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startRow.m_value;
      vStack_160.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_178.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_cols.m_value;
      pMStack_170 = local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr;
      local_188._0_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      local_188._8_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           _8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_f8,(Lhs *)local_68,(Rhs *)local_188,&local_209);
      if (local_c8.m_value == 0) {
        local_1c0 = 0.0;
      }
      else {
        local_1c0 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_f8,(scalar_sum_op<double,_double> *)&local_209);
      }
      if (*(int *)(nodevals[5].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols + 4) == 1) {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,2);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,1);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)(local_1f8._0_4_ +
                                      *(int *)((long)&(nodevals->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) + 1));
      }
      else {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,1);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,2);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)((*(int *)((long)&(nodevals->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1f8._0_4_) +
                                      *(int *)&nodevals[1].
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                               .m_storage.m_data + 3));
      }
      *pSVar12 = (double)(iVar23 * 2 - 1) *
                 ((local_1c8 * local_140 - local_1d0 * (double)local_200) - local_1c0);
      free(local_1e8.m_storage.m_data);
      uVar18 = local_1f8._0_4_;
    }
    if (uVar18 <= *(uint *)((long)&nodevals[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                   m_storage.m_data + 4)) {
      local_f8 = nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                 m_storage.m_data + 1;
      local_1e8.m_storage.m_data = (double *)0x0;
      local_1e8.m_storage.m_rows = 0;
      local_f0.m_expression.m_matrix = (NestedExpressionType)(non_const_type)local_1f8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1e8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1605:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_f8);
      LVar8.m_expression.m_matrix = local_f0.m_expression.m_matrix;
      pdVar20 = (double *)*local_f8;
      dVar3 = local_f8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1e8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1605:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_f8,(assign_op<double,_double> *)local_188);
      if (0 < local_1e8.m_storage.m_rows) {
        pdVar4 = local_1e8.m_storage.m_data;
        lVar25 = 0;
        do {
          dVar27 = LegendreDx(*(int *)LVar8.m_expression.m_matrix - 1,*pdVar20,1.0);
          pdVar4[lVar25] = dVar27;
          lVar25 = lVar25 + 1;
          pdVar20 = pdVar20 + (long)dVar3;
        } while (lVar25 < local_1e8.m_storage.m_rows);
      }
      local_1b8.m_storage.m_data =
           nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_data + 4;
      local_198._0_8_ = &local_1e8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                       *)local_68,(Lhs *)&local_1b8,(Rhs *)local_198,
                      (scalar_product_op<double,_double> *)local_188);
      pDVar6 = local_1a0;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_138,
                 (Matrix<double,_1,__1,_1,_1,__1> *)local_1a0,0,local_88,1,local_90);
      local_158 = local_138.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_outerStride;
      local_168.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startRow.m_value;
      vStack_160.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_178.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_cols.m_value;
      pMStack_170 = local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr;
      local_188._0_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      local_188._8_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           _8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_f8,(Lhs *)local_68,(Rhs *)local_188,&local_209);
      if (local_c8.m_value == 0) {
        local_1c0 = 0.0;
      }
      else {
        local_1c0 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_f8,(scalar_sum_op<double,_double> *)&local_209);
      }
      if (*(int *)(nodevals[5].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols + 8) == 1) {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,3);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,2);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)(uint)(*(int *)((long)&(nodevals->
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) + local_1f8._0_4_ +
                                           *(int *)&nodevals[1].
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  .m_storage.m_data));
      }
      else {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,2);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,3);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)(*(int *)((long)&nodevals[1].
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  .m_storage.m_data + 4) +
                                      (*(int *)((long)&(nodevals->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1f8._0_4_) +
                                      *(int *)&nodevals[1].
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                               .m_storage.m_data + 2));
      }
      *pSVar12 = (double)(iVar23 * 2 - 1) *
                 ((local_1c8 * local_140 - local_1d0 * (double)local_200) - local_1c0);
      free(local_1e8.m_storage.m_data);
      uVar18 = local_1f8._0_4_;
    }
    if (uVar18 <= (uint)nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_cols) {
      local_f8 = (double *)
                 (nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols + 8);
      local_1e8.m_storage.m_data = (double *)0x0;
      local_1e8.m_storage.m_rows = 0;
      local_f0.m_expression.m_matrix = (NestedExpressionType)(non_const_type)local_1f8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1e8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1623:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_f8);
      LVar8.m_expression.m_matrix = local_f0.m_expression.m_matrix;
      pdVar20 = (double *)*local_f8;
      dVar3 = local_f8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1e8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1623:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_f8,(assign_op<double,_double> *)local_188);
      if (0 < local_1e8.m_storage.m_rows) {
        pdVar4 = local_1e8.m_storage.m_data;
        lVar25 = 0;
        do {
          dVar27 = LegendreDx(*(int *)LVar8.m_expression.m_matrix - 1,*pdVar20,1.0);
          pdVar4[lVar25] = dVar27;
          lVar25 = lVar25 + 1;
          pdVar20 = pdVar20 + (long)dVar3;
        } while (lVar25 < local_1e8.m_storage.m_rows);
      }
      local_1b8.m_storage.m_data =
           (double *)
           (nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols + 0x20);
      local_198._0_8_ = &local_1e8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                       *)local_68,(Lhs *)&local_1b8,(Rhs *)local_198,
                      (scalar_product_op<double,_double> *)local_188);
      pDVar6 = local_1a0;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_138,
                 (Matrix<double,_1,__1,_1,_1,__1> *)local_1a0,0,local_148,1,local_98);
      local_158 = local_138.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_outerStride;
      local_168.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startRow.m_value;
      vStack_160.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_178.m_value =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_cols.m_value;
      pMStack_170 = local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr;
      local_188._0_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           m_data;
      local_188._8_8_ =
           local_138.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           _8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_f8,(Lhs *)local_68,(Rhs *)local_188,&local_209);
      if (local_c8.m_value == 0) {
        local_1c0 = 0.0;
      }
      else {
        local_1c0 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_f8,(scalar_sum_op<double,_double> *)&local_209);
      }
      if (*(int *)(nodevals[5].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols + 0xc) == 1) {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,0);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,3);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)((*(int *)((long)&nodevals[1].
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  .m_storage.m_data + 4) +
                                      *(int *)((long)&(nodevals->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) + local_1f8._0_4_ +
                                      *(int *)&nodevals[1].
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                               .m_storage.m_data) - 1));
      }
      else {
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,3);
        local_1c8 = *pdVar11;
        pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                            (pDVar6,0);
        local_1d0 = *pdVar11;
        iVar23 = local_1f8._0_4_;
        pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_208
                             ,(ulong)((int)nodevals[1].
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                           .m_storage.m_cols +
                                      (*(int *)((long)&(nodevals->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1f8._0_4_) +
                                      *(int *)&nodevals[1].
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                               .m_storage.m_data +
                                      *(int *)((long)&nodevals[1].
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  .m_storage.m_data + 4) + 1));
      }
      *pSVar12 = (double)(iVar23 * 2 - 1) *
                 ((local_140 * local_1c8 - local_1d0 * (double)local_200) - local_1c0);
      free(local_1e8.m_storage.m_data);
      uVar18 = local_1f8._0_4_;
    }
    uVar18 = uVar18 + 1;
  }
  uVar18 = (uint)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                 m_storage.m_cols;
  uVar26 = (ulong)uVar18;
  if (1 < uVar18) {
    uVar10 = *(int *)(nodevals[5].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                      m_storage.m_data + 3) + 2;
    uVar26 = (ulong)uVar10;
    local_1e8.m_storage.m_data = (double *)0x0;
    local_1e8.m_storage.m_rows = 0;
    local_1e8.m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&local_1e8,uVar26,(ulong)(uVar18 - 1));
    local_200 = nodevals + 4;
    if (uVar26 != 0) {
      local_148 = (ulong)((int)local_148 + local_fc);
      i = 0;
      do {
        Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                  ((Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)local_188,
                   (Matrix<double,_1,__1,_1,_1,__1> *)local_1a0,0,
                   (ulong)(uVar10 * (int)i + (int)local_148),1,uVar26);
        local_1b8.m_storage.m_data = (double *)0x0;
        local_1b8.m_storage.m_rows = 0;
        if ((local_178.m_value != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_178.m_value),0
                  ) < 1)) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = &std::out_of_range::vtable;
          __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_1b8,1,
                   local_178.m_value);
        uVar7 = local_188._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>,double,double>
                  ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1b8,
                   (Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)local_188,
                   (assign_op<double,_double> *)&local_138);
        uVar15 = local_1b8.m_storage.m_rows - (local_1b8.m_storage.m_rows >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < local_1b8.m_storage.m_rows) {
          lVar25 = 0;
          do {
            pRVar1 = (RefEl *)uVar7 + lVar25 * 8;
            pdVar20 = (((MatrixXd *)(pRVar1 + 8))->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data;
            puVar13 = (undefined8 *)((long)local_1b8.m_storage.m_data + lVar25 * 8);
            *puVar13 = *(undefined8 *)pRVar1;
            puVar13[1] = pdVar20;
            lVar25 = lVar25 + 2;
          } while (lVar25 < (long)uVar15);
        }
        if ((long)uVar15 < local_1b8.m_storage.m_rows) {
          do {
            *(undefined8 *)((long)local_1b8.m_storage.m_data + uVar15 * 8) =
                 *(undefined8 *)((RefEl *)uVar7 + uVar15 * 8);
            uVar15 = uVar15 + 1;
          } while (local_1b8.m_storage.m_rows != uVar15);
        }
        FeHierarchicSegment<double>::NodalValuesToDofs(local_68,local_200);
        Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
                   (Matrix<double,_1,__1,_1,_1,__1> *)local_68,0,2,1,
                   (ulong)((int)(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols - 1));
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  (&local_138,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1e8,i);
        pdVar20 = local_f8;
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,double,double>
                  (&local_138,
                   (Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
                   (assign_op<double,_double> *)local_198);
        if (0 < local_138.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                .m_cols.m_value) {
          lVar25 = ((local_138.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar21 = 0;
          pQVar14 = (QuadRule *)
                    local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                    .m_data;
          do {
            *(double **)pQVar14 = (double *)pdVar20[lVar21];
            lVar21 = lVar21 + 1;
            pQVar14 = (QuadRule *)
                      (&((DenseStorage<double,__1,_1,__1,_1> *)&pQVar14->ref_el_)->m_data + lVar25);
          } while (local_138.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                   .m_cols.m_value != lVar21);
        }
        free(local_68[0].super_ScalarReferenceFiniteElement<double>.
             _vptr_ScalarReferenceFiniteElement);
        free(local_1b8.m_storage.m_data);
        i = i + 1;
      } while (i != uVar26);
    }
    uVar26 = (ulong)((int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols - 1);
    local_1b8.m_storage.m_data = (double *)0x0;
    local_1b8.m_storage.m_rows = 0;
    local_1b8.m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&local_1b8,uVar26,uVar26);
    uVar18 = 0;
    if ((int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
             m_cols != 1) {
      uVar26 = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_188,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_1e8,uVar26);
        local_1f8 = (undefined1  [16])0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_1f8,1,
                   local_188._8_8_);
        uVar7 = local_188._0_8_;
        local_138.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_data = (PointerType)local_1f8;
        Eigen::internal::
        resize_if_allowed<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                  ((Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_138,
                   (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_188,
                   (assign_op<double,_double> *)local_68);
        pdVar20 = (double *)
                  *local_138.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                   .m_data;
        pdVar4 = (((MatrixXd *)
                  ((long)local_138.
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                         .m_data + 8))->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
        pdVar16 = (double *)((long)pdVar4 - ((long)pdVar4 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pdVar4) {
          lVar25 = 0;
          do {
            pRVar1 = (RefEl *)uVar7 + lVar25 * 8;
            pdVar5 = (((MatrixXd *)(pRVar1 + 8))->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data;
            pdVar2 = pdVar20 + lVar25;
            *pdVar2 = *(double *)pRVar1;
            pdVar2[1] = (double)pdVar5;
            lVar25 = lVar25 + 2;
          } while (lVar25 < (long)pdVar16);
        }
        if ((long)pdVar16 < (long)pdVar4) {
          do {
            pdVar20[(long)pdVar16] = *(double *)((RefEl *)uVar7 + (long)pdVar16 * 8);
            pdVar16 = (double *)((long)pdVar16 + 1);
          } while (pdVar4 != pdVar16);
        }
        FeHierarchicSegment<double>::NodalValuesToDofs
                  ((FeHierarchicSegment<double> *)local_198,local_200);
        Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
                   (Matrix<double,_1,__1,_1,_1,__1> *)local_198,0,2,1,
                   (ulong)((int)(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols - 1));
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  (&local_138,(Matrix<double,__1,__1,_0,__1,__1> *)&local_1b8,uVar26);
        pdVar20 = local_f8;
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,double,double>
                  (&local_138,
                   (Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
                   (assign_op<double,_double> *)local_68);
        if (0 < local_138.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                .m_cols.m_value) {
          lVar25 = ((local_138.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar21 = 0;
          pQVar14 = (QuadRule *)
                    local_138.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                    .m_data;
          do {
            *(double **)pQVar14 = (double *)pdVar20[lVar21];
            lVar21 = lVar21 + 1;
            pQVar14 = (QuadRule *)(&pQVar14->ref_el_ + lVar25 * 8);
          } while (local_138.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                   .m_cols.m_value != lVar21);
        }
        uVar18 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols - 1;
        Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)local_68,
                   (Matrix<double,_1,__1,_1,_1,__1> *)local_208,0,
                   (ulong)((int)nodevals[1].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                m_storage.m_cols +
                           *(int *)&nodevals[1].
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                    m_storage.m_data +
                           *(int *)((long)&nodevals[1].
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                           .m_storage.m_data + 4) +
                           *(int *)((long)&(nodevals->
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                           ).m_storage.m_cols + 4) + (int)uVar26 * uVar18),1,
                   (ulong)uVar18);
        pQVar14 = (QuadRule *)
                  local_138.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                  .m_data;
        lVar25 = ((local_138.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,double,double>
                  ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)local_68,
                   &local_138,(assign_op<double,_double> *)&local_209);
        if (0 < (long)local_68[0].qr_dual_) {
          lVar21 = 0;
          do {
            local_68[0].super_ScalarReferenceFiniteElement<double>.
            _vptr_ScalarReferenceFiniteElement[lVar21] = (_func_int *)*(double **)pQVar14;
            lVar21 = lVar21 + 1;
            pQVar14 = (QuadRule *)
                      (&((DenseStorage<double,__1,_1,__1,_1> *)&pQVar14->ref_el_)->m_data + lVar25);
          } while (local_68[0].qr_dual_ != (QuadRule *)lVar21);
        }
        free((void *)local_198._0_8_);
        free((void *)local_1f8._0_8_);
        uVar26 = uVar26 + 1;
        uVar18 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols - 1;
      } while (uVar26 < uVar18);
    }
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_188,local_1b8.m_storage.m_data,1,(ulong)(uVar18 * uVar18));
    iVar23 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                  m_storage.m_cols + -1;
    Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
               (Matrix<double,_1,__1,_1,_1,__1> *)local_208,0,
               (ulong)(uint)((int)nodevals[1].
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                  m_storage.m_cols +
                             *(int *)&nodevals[1].
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                      .m_storage.m_data +
                            *(int *)((long)&nodevals[1].
                                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                            .m_storage.m_data + 4) +
                            *(int *)((long)&(nodevals->
                                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                            ).m_storage.m_cols + 4)),1,
               (ulong)(uint)(iVar23 * iVar23));
    uVar7 = local_188._0_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,double,double>
              ((Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> *)&local_f8,
               (Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_188,
               (assign_op<double,_double> *)&local_138);
    RVar17.m_expression = local_e8.m_expression;
    if ((((ulong)local_f8 & 7) == 0) &&
       (RVar17.m_expression = (NestedExpressionType)(ulong)((uint)((ulong)local_f8 >> 3) & 1),
       (long)local_e8.m_expression <= (long)RVar17.m_expression)) {
      RVar17.m_expression = local_e8.m_expression;
    }
    lVar25 = (long)local_e8.m_expression - (long)RVar17.m_expression;
    if (0 < (long)RVar17.m_expression) {
      pMVar22 = (NestedExpressionType)0x0;
      do {
        local_f8[(long)pMVar22] = *(double *)((RefEl *)uVar7 + (long)pMVar22 * 8);
        pMVar22 = (NestedExpressionType)
                  ((long)&(pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                          m_storage.m_data + 1);
      } while (RVar17.m_expression != pMVar22);
    }
    pMVar22 = (NestedExpressionType)
              ((long)&((RVar17.m_expression)->
                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                      m_data + (lVar25 - (lVar25 >> 0x3f) & 0xfffffffffffffffeU));
    if (1 < lVar25) {
      do {
        pdVar20 = (((MatrixXd *)((RefEl *)uVar7 + (long)RVar17.m_expression * 8 + 8))->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
        ;
        local_f8[(long)RVar17.m_expression] =
             *(double *)((RefEl *)uVar7 + (long)RVar17.m_expression * 8);
        (local_f8 + (long)RVar17.m_expression)[1] = (double)pdVar20;
        RVar17.m_expression =
             (NestedExpressionType)
             ((long)&((RVar17.m_expression)->
                     super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                     m_data + 2);
      } while ((long)RVar17.m_expression < (long)pMVar22);
    }
    if ((long)pMVar22 < (long)local_e8.m_expression) {
      do {
        local_f8[(long)pMVar22] = *(double *)((RefEl *)uVar7 + (long)pMVar22 * 8);
        pMVar22 = (NestedExpressionType)
                  ((long)&(pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                          m_storage.m_data + 1);
      } while (local_e8.m_expression != pMVar22);
    }
    free(local_1b8.m_storage.m_data);
    free(local_1e8.m_storage.m_data);
    uVar26 = extraout_RDX;
  }
  MVar28.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = uVar26;
  MVar28.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)local_208;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar28.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    const base::size_type Ne0 =
        edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const base::size_type Ne1 =
        edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const base::size_type Ne2 =
        edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const base::size_type Ne3 =
        edge_degrees_[3] > 1 ? qr_dual_edge_[3]->NumPoints() : 0;

    // Compute the basis function coefficients of the vertex basis functions
    dofs[0] = nodevals[0];
    dofs[1] = nodevals[1];
    dofs[2] = nodevals[2];
    dofs[3] = nodevals[3];
    // Compute the basis function coefficients on the edges
    // by applying the dual basis of the segment
    for (lf::base::size_type i = 2; i < Degree() + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);

      // Compute the basis function coefficients for the first edge
      if (i <= edge_degrees_[0]) {
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[0]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ1 = (qr_dual_edge_[0]->Weights().transpose().array() *
                               psidd.array() * nodevals.segment(4, Ne0).array())
                                  .sum();
        if (rel_orient_[0] == lf::mesh::Orientation::positive) {
          dofs[2 + i] =
              (P1 * nodevals[1] - P0 * nodevals[0] - integ1) * (2 * i - 1);
        } else {
          dofs[5 - i + (edge_degrees_[0] - 1)] =
              (P1 * nodevals[0] - P0 * nodevals[1] - integ1) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[1]) {
        // Compute the basis function coefficients for the second edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[1]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ2 =
            (qr_dual_edge_[1]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0, Ne1).array())
                .sum();
        if (rel_orient_[1] == lf::mesh::Orientation::positive) {
          dofs[2 + i + (edge_degrees_[0] - 1)] =
              (P1 * nodevals[2] - P0 * nodevals[1] - integ2) * (2 * i - 1);
        } else {
          dofs[5 - i + (edge_degrees_[0] + edge_degrees_[1] - 2)] =
              (P1 * nodevals[1] - P0 * nodevals[2] - integ2) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[2]) {
        // Compute the basis function coefficients for the third edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[2]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ3 =
            (qr_dual_edge_[2]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0 + Ne1, Ne2).array())
                .sum();
        if (rel_orient_[2] == lf::mesh::Orientation::positive) {
          dofs[2 + i + (edge_degrees_[0] + edge_degrees_[1] - 2)] =
              (P1 * nodevals[3] - P0 * nodevals[2] - integ3) * (2 * i - 1);
        } else {
          dofs[5 - i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3)] =
              (P1 * nodevals[2] - P0 * nodevals[3] - integ3) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[3]) {
        // Compute the basis function coefficients for the fourth edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[3]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ4 =
            (qr_dual_edge_[3]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0 + Ne1 + Ne2, Ne3).array())
                .sum();
        if (rel_orient_[3] == lf::mesh::Orientation::positive) {
          dofs[2 + i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3)] =
              (P1 * nodevals[0] - P0 * nodevals[3] - integ4) * (2 * i - 1);
        } else {
          dofs[5 - i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                edge_degrees_[3] - 4)] =
              (P1 * nodevals[3] - P0 * nodevals[0] - integ4) * (2 * i - 1);
        }
      }
    }
    if (interior_degree_ > 1) {
      // Compute the basis function coefficients for the face bubbles
      auto Nq = fe1d_.NumEvaluationNodes();
      Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> dof_temp(
          Nq, interior_degree_ - 1);
      for (unsigned i = 0; i < Nq; ++i) {
        dof_temp.row(i) = fe1d_
                              .NodalValuesToDofs(nodevals.segment(
                                  4 + Ne0 + Ne1 + Ne2 + Ne3 + Nq * i, Nq))
                              .segment(2, interior_degree_ - 1);
      }
      Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> dof_temp2(
          interior_degree_ - 1, interior_degree_ - 1);
      for (unsigned i = 0; i < interior_degree_ - 1; ++i) {
        dofs.segment(edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                         edge_degrees_[3] + i * (interior_degree_ - 1),
                     interior_degree_ - 1) = dof_temp2.row(i) =
            fe1d_.NodalValuesToDofs(dof_temp.col(i))
                .segment(2, interior_degree_ - 1);
      }
      dofs.segment(edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                       edge_degrees_[3],
                   (interior_degree_ - 1) * (interior_degree_ - 1)) =
          Eigen::Map<Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>>(
              dof_temp2.data(), 1,
              (interior_degree_ - 1) * (interior_degree_ - 1));
    }
    return dofs;
  }